

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O1

int resolve_instid(lyd_node *data,char *path,int req_inst,lyd_node **ret)

{
  char cVar1;
  byte bVar2;
  lyd_node *plVar3;
  lyd_node *plVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar9;
  lys_module *plVar10;
  lys_module *plVar11;
  ushort **ppuVar12;
  void *pvVar13;
  ulong uVar14;
  undefined8 *puVar15;
  char *pcVar16;
  lyd_node *plVar17;
  ulong uVar18;
  lyd_node *plVar19;
  int iVar20;
  uint uVar21;
  LY_VLOG_ELEM elem_type;
  uint uVar22;
  long lVar23;
  size_t sVar24;
  LY_ECODE ecode;
  char *noncan_val;
  LYS_NODE LVar25;
  ly_ctx *plVar26;
  uint uVar27;
  int iVar28;
  ulong uVar29;
  ulong uVar30;
  char *pcVar31;
  long *plVar32;
  long lVar33;
  ulong uVar34;
  bool bVar35;
  char *in_stack_fffffffffffffed0;
  char *local_110;
  char *model;
  int local_100;
  int local_fc;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *name;
  int local_d4;
  int local_d0;
  int mod_len;
  char *local_c8;
  ulong local_c0;
  char *local_b8;
  undefined8 *local_b0;
  ushort **local_a8;
  lyd_node *local_a0;
  uint local_94;
  char *local_90;
  ly_ctx *local_88;
  ly_ctx *local_80;
  uint local_74;
  ulong local_70;
  lys_module *local_68;
  ulong local_60;
  char *local_58;
  long *local_50;
  undefined8 *local_48;
  void *local_40;
  char local_31;
  
  local_80 = data->schema->module->ctx;
  *ret = (lyd_node *)0x0;
  plVar19 = data;
  do {
    plVar17 = plVar19;
    plVar19 = plVar17->parent;
  } while (plVar17->parent != (lyd_node *)0x0);
  plVar19 = plVar17->prev;
  plVar4 = plVar17;
  while (plVar3 = plVar17, plVar19 != (lyd_node *)0x0) {
    plVar17 = plVar3->prev;
    plVar19 = plVar17->next;
    plVar4 = plVar3;
  }
  local_100 = -(int)path;
  local_f0 = (char *)0x0;
  local_48 = (undefined8 *)0x0;
  local_70 = 0;
  plVar10 = (lys_module *)0x0;
  uVar14 = 0;
  local_fc = req_inst;
  local_b8 = path;
  local_a0 = data;
  do {
    local_31 = '\x01';
    if (local_b8[uVar14] == '/') {
      pcVar9 = local_b8 + uVar14 + 1;
      uVar6 = parse_identifier(pcVar9);
      uVar8 = CONCAT44(extraout_var,uVar6);
      if (0 < (int)uVar6) {
        pcVar16 = pcVar9 + uVar6;
        if (pcVar9[uVar6] == ':') {
          pcVar31 = pcVar16 + 1;
          uVar22 = parse_identifier(pcVar31);
          uVar8 = CONCAT44(extraout_var_00,uVar22);
          local_f8 = pcVar9;
          local_f0 = pcVar9;
          mod_len = uVar6;
          local_94 = uVar6;
          if ((int)uVar22 < 1) goto LAB_0011b5f8;
          uVar6 = uVar6 + uVar22 + 2;
          pcVar16 = pcVar31 + uVar22;
        }
        else {
          uVar6 = uVar6 + 1;
          pcVar31 = pcVar9;
        }
        local_31 = *pcVar16 != '[';
        local_94 = (uint)uVar8;
        uVar8 = (ulong)uVar6;
        local_f8 = pcVar31;
      }
    }
    else {
      uVar8 = 0;
      if (local_b8[uVar14] == '\0') {
LAB_0011c28b:
        puVar15 = local_48;
        if ((int)local_70 == 1) {
          *ret = (lyd_node *)*local_48;
          free(local_48);
          iVar7 = 0;
        }
        else if ((int)local_70 == 0) {
          if (local_fc < 0) {
            iVar7 = 0;
            ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,
                   "There is no instance of \"%s\", but it is not required.");
          }
          else {
            ly_vlog(local_80,LYE_NOREQINS,LY_VLOG_LYD,local_a0,local_b8);
            iVar7 = 1;
          }
        }
        else {
          ly_vlog(local_80,LYE_TOOMANY,LY_VLOG_LYD,local_a0,local_b8,"data tree");
LAB_0011c26a:
          free(puVar15);
          iVar7 = -1;
        }
        return iVar7;
      }
    }
LAB_0011b5f8:
    plVar26 = local_80;
    local_c0 = uVar8;
    if ((int)uVar8 < 1) {
      uVar6 = (int)uVar14 - (int)uVar8;
      ly_vlog(local_80,LYE_INCHAR,LY_VLOG_LYD,local_a0,(ulong)(uint)(int)local_b8[uVar6],
              local_b8 + uVar6);
      puVar15 = local_48;
      goto LAB_0011c26a;
    }
    if (local_f0 == (char *)0x0) {
      if (plVar10 == (lys_module *)0x0) {
        ly_vlog(local_80,LYE_INELEM_LEN,LY_VLOG_LYD,local_a0,(ulong)local_94,local_f8);
        pcVar9 = "Instance-identifier is missing prefix in the first node.";
        ecode = LYE_SPEC;
        elem_type = LY_VLOG_PREV;
        plVar19 = (lyd_node *)0x0;
LAB_0011c25f:
        ly_vlog(plVar26,ecode,elem_type,plVar19,pcVar9);
        puVar15 = local_48;
        goto LAB_0011c26a;
      }
    }
    else {
      pcVar9 = strndup(local_f0,(long)mod_len);
      plVar26 = local_80;
      if (pcVar9 == (char *)0x0) {
        ly_log(local_80,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","resolve_instid");
        puVar15 = local_48;
        goto LAB_0011c26a;
      }
      plVar10 = ly_ctx_get_module(local_80,pcVar9,(char *)0x0,1);
      if (plVar26->data_clb != (ly_module_data_clb)0x0) {
        if (plVar10 == (lys_module *)0x0) {
          pvVar13 = local_80->data_clb_data;
          pcVar16 = (char *)0x0;
          iVar7 = 0;
          pcVar31 = pcVar9;
        }
        else {
          if ((plVar10->field_0x40 & 0x80) != 0) goto LAB_0011b691;
          pcVar16 = plVar10->ns;
          pvVar13 = local_80->data_clb_data;
          iVar7 = 1;
          pcVar31 = plVar10->name;
        }
        plVar10 = (*plVar26->data_clb)(local_80,pcVar31,pcVar16,iVar7,pvVar13);
      }
LAB_0011b691:
      free(pcVar9);
      if ((plVar10 == (lys_module *)0x0) || ((*(ushort *)&plVar10->field_0x40 & 0xc0) != 0x80))
      goto LAB_0011c28b;
    }
    uVar6 = (uint)local_70;
    local_68 = plVar10;
    if (uVar6 == 0) {
      local_48 = (undefined8 *)malloc(8);
      if (local_48 != (undefined8 *)0x0) {
        *local_48 = 0;
        uVar6 = 1;
        goto LAB_0011b6e6;
      }
      plVar26 = plVar10->ctx;
      local_70 = 1;
LAB_0011b874:
      bVar35 = false;
      ly_log(plVar26,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","resolve_data");
    }
    else {
LAB_0011b6e6:
      pcVar9 = (char *)(long)(int)local_94;
      uVar8 = 0;
      pvVar13 = (void *)(ulong)uVar6;
      local_58 = pcVar9;
      do {
        plVar32 = (long *)local_48[uVar8];
        plVar19 = plVar4;
        local_40 = pvVar13;
        if (plVar32 == (long *)0x0) {
LAB_0011b731:
          if (plVar19 == (lyd_node *)0x0) {
            bVar35 = true;
          }
          else {
            local_50 = (long *)((ulong)local_50 & 0xffffffff00000000);
            do {
              plVar11 = lyd_node_module(plVar19);
              if (plVar11 == plVar10) {
                pcVar16 = plVar19->schema->name;
                iVar7 = strncmp(pcVar16,local_f8,(size_t)pcVar9);
                pvVar13 = local_40;
                plVar10 = local_68;
                if ((iVar7 == 0) && (pcVar16[(long)pcVar9] == '\0')) {
                  if ((int)local_50 == 0) {
                    local_48[uVar8] = plVar19;
                    local_50 = (long *)CONCAT44(local_50._4_4_,1);
                  }
                  else {
                    uVar6 = (int)local_40 + 1;
                    local_48 = (undefined8 *)ly_realloc(local_48,(ulong)uVar6 * 8);
                    plVar10 = local_68;
                    if (local_48 == (undefined8 *)0x0) {
                      plVar26 = local_68->ctx;
                      local_70 = (ulong)uVar6;
                      goto LAB_0011b874;
                    }
                    local_48[(ulong)pvVar13 & 0xffffffff] = plVar19;
                    uVar8 = (ulong)((int)uVar8 + 1);
                    local_50 = (long *)CONCAT44(local_50._4_4_,1);
                    local_40 = (void *)(ulong)uVar6;
                    pcVar9 = local_58;
                  }
                }
              }
              plVar19 = plVar19->next;
            } while (plVar19 != (lyd_node *)0x0);
            bVar35 = (int)local_50 == 0;
          }
          uVar6 = (int)uVar8 + 1;
          if (bVar35) {
            uVar22 = (uint)local_40;
            if (uVar22 < uVar6 || uVar22 - uVar6 == 0) {
              if ((int)uVar8 == 0) {
                free(local_48);
                local_48 = (undefined8 *)0x0;
              }
            }
            else {
              memmove(local_48 + uVar8,local_48 + uVar6,(ulong)(uVar22 - uVar6) << 3);
            }
            pvVar13 = (void *)(ulong)(uVar22 - 1);
          }
          else {
            uVar8 = (ulong)uVar6;
            pvVar13 = local_40;
          }
        }
        else {
          if ((*(ushort *)(*plVar32 + 0x38) & 0x802c) == 0) {
            plVar19 = (lyd_node *)plVar32[8];
            goto LAB_0011b731;
          }
          uVar8 = (ulong)((int)uVar8 + 1);
        }
      } while ((uint)uVar8 < (uint)pvVar13);
      bVar35 = (uint)pvVar13 != 0;
      local_70 = (ulong)pvVar13 & 0xffffffff;
    }
    if (!bVar35) goto LAB_0011c28b;
    uVar6 = (int)local_c0 + (int)uVar14;
    if (local_31 == '\0') {
      local_c0 = (ulong)uVar6;
      if ((int)local_70 < 1) {
        uVar6 = 0;
      }
      else {
        pcVar9 = local_b8 + uVar6;
        model._4_4_ = local_100 - uVar6;
        uVar14 = 0;
        local_d0 = 1;
        local_90 = pcVar9;
        do {
          plVar32 = (long *)local_48[(int)uVar14];
          if (plVar32 == (long *)0x0) {
            __assert_fail("pred && node && *node",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                          ,0x1176,
                          "int resolve_instid_predicate(const struct lys_module *, const char *, struct lyd_node **, int)"
                         );
          }
          local_88 = plVar10->ctx;
          local_40 = (void *)0x0;
          local_b0 = (undefined8 *)0x0;
          uVar8 = 0;
          local_60 = uVar14;
          do {
            iVar7 = (int)uVar8;
            local_110 = (char *)0x0;
            local_d4 = 0;
            local_e8 = (char *)0x0;
            local_74 = 0;
            local_31 = '\x01';
            local_50 = plVar32;
            if (pcVar9[uVar8] == '[') {
              local_58 = (char *)CONCAT44(local_58._4_4_,iVar7);
              ppuVar12 = __ctype_b_loc();
              uVar34 = 1;
              uVar30 = 0;
              do {
                uVar29 = uVar30;
                uVar18 = uVar34;
                cVar1 = pcVar9[uVar29 + uVar8 + 1];
                uVar30 = uVar29 + 1;
                uVar34 = uVar18 + 1;
              } while (((*ppuVar12)[cVar1] >> 0xd & 1) != 0);
              pcVar16 = pcVar9 + uVar30 + uVar8;
              iVar20 = (int)uVar30;
              iVar7 = (int)local_58;
              if (((*ppuVar12)[cVar1] >> 0xb & 1) == 0) {
                if (cVar1 == '.') {
                  local_74 = 1;
                  lVar5 = uVar30 + uVar8 + 1;
                  uVar30 = uVar29 + 2;
                  local_e8 = pcVar16;
LAB_0011bb18:
                  pcVar31 = pcVar9 + lVar5;
                  cVar1 = *pcVar31;
                  while (iVar28 = (int)uVar30,
                        (*(byte *)((long)*ppuVar12 + (long)cVar1 * 2 + 1) & 0x20) != 0) {
                    uVar30 = (ulong)(iVar28 + 1);
                    cVar1 = pcVar31[1];
                    pcVar31 = pcVar31 + 1;
                  }
                  if (cVar1 != '=') goto LAB_0011bc0b;
                  uVar6 = -(uint)pcVar31;
                  pcVar9 = (char *)(ulong)uVar6;
                  lVar33 = 0;
                  lVar5 = 0;
                  do {
                    lVar23 = lVar5;
                    cVar1 = pcVar31[lVar23 + 1];
                    uVar6 = uVar6 - 1;
                    lVar33 = lVar33 + -1;
                    lVar5 = lVar23 + 1;
                  } while ((*(byte *)((long)*ppuVar12 + (long)cVar1 * 2 + 1) & 0x20) != 0);
                  iVar20 = (int)(lVar23 + 1);
                  if ((cVar1 != '\'') && (cVar1 != '\"')) {
                    uVar6 = -(iVar28 + iVar20);
                    noncan_val = (char *)0x0;
                    iVar20 = 0;
                    uVar14 = local_60;
                    pcVar9 = local_90;
                    plVar10 = local_68;
                    goto LAB_0011bc16;
                  }
                  local_c8 = pcVar31 + lVar23 + 2;
                  name = pcVar9;
                  local_a8 = ppuVar12;
                  pcVar9 = strchr(local_c8,(int)cVar1);
                  uVar14 = local_60;
                  if (pcVar9 != (char *)0x0) {
                    iVar7 = (int)pcVar9;
                    iVar20 = (~(uint)pcVar31 + iVar7) - iVar20;
                    uVar18 = (ulong)((int)name + iVar7 + iVar28 + 1);
                    pcVar31 = pcVar31 + ((int)(uVar6 + iVar7) - lVar33) + 1;
                    ppuVar12 = local_a8;
                    noncan_val = local_c8;
                    iVar7 = (int)local_58;
                    goto LAB_0011bbe4;
                  }
                  uVar6 = ~(iVar28 + iVar20);
                  pcVar9 = local_90;
                  plVar10 = local_68;
                }
                else {
                  local_a8 = ppuVar12;
                  uVar6 = parse_node_identifier
                                    (pcVar16,&local_110,&local_d4,&local_e8,(int *)&local_74,
                                     (int *)0x0,0);
                  if (0 < (int)uVar6) {
                    lVar5 = (ulong)uVar6 + uVar30 + uVar8;
                    uVar30 = (ulong)(uVar6 + iVar20);
                    ppuVar12 = local_a8;
                    iVar7 = (int)local_58;
                    goto LAB_0011bb18;
                  }
                  uVar6 = uVar6 - iVar20;
                }
                noncan_val = (char *)0x0;
                iVar20 = 0;
                iVar7 = (int)local_58;
              }
              else {
                local_e8 = pcVar16;
                if (cVar1 == '0') {
LAB_0011bc0b:
                  uVar6 = -(int)uVar30;
                  goto LAB_0011bc12;
                }
                if ((*(byte *)((long)*ppuVar12 + (long)cVar1 * 2 + 1) & 8) == 0) {
                  uVar18 = uVar30 & 0xffffffff;
                  pcVar31 = pcVar16;
                }
                else {
                  do {
                    lVar5 = uVar18 + uVar8 + 1;
                    uVar18 = uVar18 + 1;
                  } while ((*(byte *)((long)*ppuVar12 + (long)pcVar9[lVar5] * 2 + 1) & 8) != 0);
                  pcVar31 = pcVar9 + uVar18 + uVar8;
                }
                local_74 = ((model._4_4_ - (int)local_58) + (int)pcVar31) - iVar20;
                noncan_val = (char *)0x0;
                iVar20 = 0;
LAB_0011bbe4:
                uVar6 = (uint)uVar18;
                cVar1 = *pcVar31;
                bVar2 = *(byte *)((long)*ppuVar12 + (long)cVar1 * 2 + 1);
                while ((bVar2 & 0x20) != 0) {
                  uVar6 = (int)uVar18 + 1;
                  uVar18 = (ulong)uVar6;
                  cVar1 = pcVar31[1];
                  pcVar31 = pcVar31 + 1;
                  bVar2 = *(byte *)((long)*ppuVar12 + (long)cVar1 * 2 + 1);
                }
                pcVar9 = local_90;
                plVar10 = local_68;
                if (cVar1 == ']') {
                  uVar6 = uVar6 + 1;
                  local_31 = pcVar31[1] != '[';
                }
                else {
                  uVar6 = -uVar6;
                }
              }
            }
            else {
              uVar6 = 0;
LAB_0011bc12:
              noncan_val = (char *)0x0;
              iVar20 = 0;
            }
LAB_0011bc16:
            plVar32 = local_50;
            if ((int)uVar6 < 1) {
              uVar6 = uVar6 - iVar7;
              goto LAB_0011c039;
            }
            uVar6 = uVar6 + iVar7;
            uVar8 = (ulong)uVar6;
            if (local_50 != (long *)0x0) {
              local_58 = local_e8;
              cVar1 = *local_e8;
              if ((long)cVar1 != 0x2e) {
                local_a8 = (ushort **)CONCAT44(local_a8._4_4_,iVar20);
                local_c8 = noncan_val;
                ppuVar12 = __ctype_b_loc();
                uVar14 = local_60;
                if ((*(byte *)((long)*ppuVar12 + (long)cVar1 * 2 + 1) & 8) == 0) {
                  local_b0 = (undefined8 *)*plVar32;
                  LVar25 = *(LYS_NODE *)(local_b0 + 7);
                  if (LVar25 == LYS_LIST) {
                    pvVar13 = local_40;
                    if (local_40 == (void *)0x0) {
                      bVar2 = *(byte *)((long)local_b0 + 0x1e);
                      pvVar13 = malloc((ulong)((uint)bVar2 * 8));
                      if (pvVar13 == (void *)0x0) {
                        ly_log(local_88,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                               "resolve_instid_predicate");
                        uVar6 = 0xffffffff;
                        uVar14 = local_60;
                        goto LAB_0011c039;
                      }
                      if ((ulong)bVar2 != 0) {
                        uVar14 = 0;
                        do {
                          *(undefined8 *)((long)pvVar13 + uVar14 * 8) =
                               *(undefined8 *)(local_b0[0x11] + uVar14 * 8);
                          uVar14 = uVar14 + 1;
                        } while (bVar2 != uVar14);
                      }
                    }
                    bVar2 = *(byte *)((long)local_b0 + 0x1e);
                    uVar22 = (uint)bVar2;
                    local_40 = pvVar13;
                    if (bVar2 == 0) {
                      uVar34 = 0;
                    }
                    else {
                      sVar24 = (size_t)(int)local_74;
                      name = (char *)CONCAT44(name._4_4_,(uint)bVar2);
                      uVar34 = 0;
                      do {
                        puVar15 = *(undefined8 **)((long)pvVar13 + uVar34 * 8);
                        if (puVar15 != (undefined8 *)0x0) {
                          pcVar9 = (char *)*puVar15;
                          iVar7 = strncmp(pcVar9,local_58,sVar24);
                          pvVar13 = local_40;
                          if ((iVar7 == 0) && (pcVar9[sVar24] == '\0')) {
                            plVar32 = local_50;
                            uVar22 = (uint)name;
                            goto LAB_0011be6c;
                          }
                        }
                        uVar34 = uVar34 + 1;
                      } while ((uint)bVar2 != uVar34);
                      uVar34 = (ulong)name & 0xffffffff;
                      plVar32 = local_50;
                      uVar22 = (uint)name;
                    }
LAB_0011be6c:
                    uVar14 = local_60;
                    plVar10 = local_68;
                    iVar7 = local_d4;
                    pcVar9 = local_110;
                    if ((uint)uVar34 == uVar22) {
                      in_stack_fffffffffffffed0 = (char *)*local_b0;
                      uVar6 = 0xffffffff;
                      ly_vlog(local_88,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
                              "Instance identifier expects list with the key \"%.*s\", but list \"%s\" does not define it."
                              ,(ulong)local_74,local_58,in_stack_fffffffffffffed0);
                      pcVar9 = local_90;
                      plVar10 = local_68;
                    }
                    else {
                      pcVar16 = (char *)(uVar34 & 0xffffffff);
                      local_58 = *(char **)((long)pvVar13 + (long)pcVar16 * 8);
                      plVar11 = *(lys_module **)(local_58 + 0x30);
                      if (local_110 == (char *)0x0) {
                        if (plVar11 == local_68) goto LAB_0011beeb;
                        in_stack_fffffffffffffed0 = plVar11->name;
                        ly_vlog(local_88,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
                                "Instance identifier expects key \"%s\" from module \"%s\", not \"%s\"."
                                ,*(undefined8 *)local_58,local_68->name,in_stack_fffffffffffffed0);
                      }
                      else {
                        pcVar31 = plVar11->name;
                        sVar24 = (size_t)local_d4;
                        iVar20 = strncmp(pcVar31,local_110,sVar24);
                        if ((iVar20 == 0) && (pvVar13 = local_40, pcVar31[sVar24] == '\0')) {
LAB_0011beeb:
                          plVar32 = local_50;
                          uVar14 = local_60;
                          plVar10 = local_68;
                          pcVar9 = local_90;
                          puVar15 = (undefined8 *)local_50[8];
                          if (puVar15 != (undefined8 *)0x0) {
                            while ((lys_node *)*puVar15 !=
                                   *(lys_node **)((long)pvVar13 + (long)pcVar16 * 8)) {
                              puVar15 = (undefined8 *)puVar15[3];
                              if (puVar15 == (undefined8 *)0x0) goto LAB_0011bf4c;
                            }
                            local_58 = pcVar16;
                            iVar7 = valequal((lys_node *)*puVar15,local_c8,(int)local_a8,
                                             (char *)puVar15[7]);
                            if (iVar7 == 0) {
                              plVar32 = (long *)0x0;
                            }
                            else {
                              *(undefined8 *)((long)local_40 + (long)local_58 * 8) = 0;
                            }
                            goto LAB_0011bdb3;
                          }
LAB_0011bf4c:
                          ly_log(local_88,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                                 ,0x11e6);
                          uVar6 = 0xffffffff;
                          goto LAB_0011c031;
                        }
                        in_stack_fffffffffffffed0 =
                             (char *)CONCAT44((int)((ulong)in_stack_fffffffffffffed0 >> 0x20),iVar7)
                        ;
                        ly_vlog(local_88,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
                                "Instance identifier expects key \"%s\" from module \"%.*s\", not \"%s\"."
                                ,*(undefined8 *)local_58,pcVar9,in_stack_fffffffffffffed0,pcVar31);
                        plVar10 = local_68;
                      }
                      uVar6 = 0xffffffff;
                      uVar14 = local_60;
                      pcVar9 = local_90;
                      plVar32 = local_50;
                    }
                    goto LAB_0011c031;
                  }
                }
                else {
                  if (local_c8 != (char *)0x0) {
                    __assert_fail("!value",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                                  ,0x1195,
                                  "int resolve_instid_predicate(const struct lys_module *, const char *, struct lyd_node **, int)"
                                 );
                  }
                  puVar15 = (undefined8 *)*plVar32;
                  LVar25 = *(LYS_NODE *)(puVar15 + 7);
                  if (LVar25 == LYS_LIST) {
                    if (puVar15[0x11] == 0) {
                      iVar7 = atoi(local_58);
                      if (iVar7 != local_d0) goto LAB_0011bfc8;
                      goto LAB_0011bdb3;
                    }
                    pcVar16 = (char *)*puVar15;
                    pcVar31 = "Instance identifier expects list without keys, but have list \"%s\"."
                    ;
                    goto LAB_0011c026;
                  }
                }
                pcVar16 = strnodetype(LVar25);
                pcVar31 = "Instance identifier expects list, but have %s \"%s\".";
                goto LAB_0011c026;
              }
              LVar25 = ((lys_node *)*local_50)->nodetype;
              uVar14 = local_60;
              if (LVar25 != LYS_LEAFLIST) {
                pcVar16 = strnodetype(LVar25);
                pcVar31 = "Instance identifier expects leaf-list, but have %s \"%s\".";
                goto LAB_0011c026;
              }
              iVar7 = valequal((lys_node *)*local_50,noncan_val,iVar20,(char *)local_50[7]);
              if (iVar7 == 0) {
LAB_0011bfc8:
                plVar32 = (long *)0x0;
                goto LAB_0011c031;
              }
            }
LAB_0011bdb3:
          } while (local_31 == '\0');
          if (((plVar32 != (long *)0x0) && (local_40 != (void *)0x0)) &&
             ((ulong)*(byte *)((long)local_b0 + 0x1e) != 0)) {
            uVar8 = 0;
LAB_0011bfb1:
            puVar15 = *(undefined8 **)((long)local_40 + uVar8 * 8);
            if (puVar15 == (undefined8 *)0x0) goto code_r0x0011bfbe;
            pcVar16 = (char *)*puVar15;
            pcVar31 = "Instance identifier is missing list key \"%s\".";
LAB_0011c026:
            uVar6 = 0xffffffff;
            ly_vlog(local_88,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,pcVar31,pcVar16);
          }
LAB_0011c031:
          free(local_40);
LAB_0011c039:
          if ((int)uVar6 < 1) {
            pcVar9 = local_b8 + ((int)local_c0 - uVar6);
            ecode = LYE_INPRED;
            elem_type = LY_VLOG_LYD;
            plVar19 = local_a0;
            plVar26 = local_80;
            goto LAB_0011c25f;
          }
          uVar22 = (int)uVar14 + 1;
          if (plVar32 == (long *)0x0) {
            uVar21 = (uint)local_70 - uVar22;
            if ((uint)local_70 < uVar22 || uVar21 == 0) {
              if ((int)uVar14 == 0) {
                free(local_48);
                local_48 = (undefined8 *)0x0;
              }
            }
            else {
              memmove(local_48 + (uVar14 & 0xffffffff),local_48 + uVar22,(ulong)uVar21 << 3);
            }
            local_70 = (ulong)((int)local_70 - 1);
          }
          else {
            uVar14 = (ulong)uVar22;
          }
          local_d0 = local_d0 + 1;
        } while ((int)uVar14 < (int)local_70);
      }
      uVar14 = (ulong)(uVar6 + (int)local_c0);
    }
    else {
      uVar14 = (ulong)uVar6;
      bVar35 = (int)local_70 != 0;
      if (bVar35) {
        uVar22 = 0;
        uVar8 = local_70;
        puVar15 = local_48;
        do {
          if (*(int *)(*(long *)puVar15[(int)uVar22] + 0x38) == 0x10) {
            uVar21 = uVar22 + 1;
            uVar27 = (uint)uVar8;
            if (uVar27 < uVar21 || uVar27 - uVar21 == 0) {
              if (uVar22 == 0) {
                free(puVar15);
                puVar15 = (undefined8 *)0x0;
              }
            }
            else {
              memmove(puVar15 + uVar22,puVar15 + uVar21,(ulong)(uVar27 - uVar21) << 3);
            }
            uVar22 = uVar22 - 1;
            uVar8 = (ulong)(uVar27 - 1);
          }
          uVar22 = uVar22 + 1;
        } while (uVar22 < (uint)uVar8);
        uVar14 = (ulong)uVar6;
        local_70 = uVar8;
        local_48 = puVar15;
        if ((uint)uVar8 == 0) {
          ly_vlog(local_80,LYE_SPEC,LY_VLOG_LYD,local_a0,"Instance identifier is missing list keys."
                 );
          uVar14 = (ulong)uVar6;
        }
      }
    }
  } while( true );
code_r0x0011bfbe:
  uVar8 = uVar8 + 1;
  if (*(byte *)((long)local_b0 + 0x1e) == uVar8) goto LAB_0011c031;
  goto LAB_0011bfb1;
}

Assistant:

static int
resolve_instid(struct lyd_node *data, const char *path, int req_inst, struct lyd_node **ret)
{
    int i = 0, j, parsed, cur_idx;
    const struct lys_module *mod, *prev_mod = NULL;
    struct ly_ctx *ctx = data->schema->module->ctx;
    struct lyd_node *root, *node;
    const char *model = NULL, *name;
    char *str;
    int mod_len, name_len, has_predicate;
    struct unres_data node_match;

    memset(&node_match, 0, sizeof node_match);
    *ret = NULL;

    /* we need root to resolve absolute path */
    for (root = data; root->parent; root = root->parent);
    /* we're still parsing it and the pointer is not correct yet */
    if (root->prev) {
        for (; root->prev->next; root = root->prev);
    }

    /* search for the instance node */
    while (path[i]) {
        j = parse_instance_identifier(&path[i], &model, &mod_len, &name, &name_len, &has_predicate);
        if (j <= 0) {
            LOGVAL(ctx, LYE_INCHAR, LY_VLOG_LYD, data, path[i-j], &path[i-j]);
            goto error;
        }
        i += j;

        if (model) {
            str = strndup(model, mod_len);
            if (!str) {
                LOGMEM(ctx);
                goto error;
            }
            mod = ly_ctx_get_module(ctx, str, NULL, 1);
            if (ctx->data_clb) {
                if (!mod) {
                    mod = ctx->data_clb(ctx, str, NULL, 0, ctx->data_clb_data);
                } else if (!mod->implemented) {
                    mod = ctx->data_clb(ctx, mod->name, mod->ns, LY_MODCLB_NOT_IMPLEMENTED, ctx->data_clb_data);
                }
            }
            free(str);

            if (!mod || !mod->implemented || mod->disabled) {
                break;
            }
        } else if (!prev_mod) {
            /* first iteration and we are missing module name */
            LOGVAL(ctx, LYE_INELEM_LEN, LY_VLOG_LYD, data, name_len, name);
            LOGVAL(ctx, LYE_SPEC, LY_VLOG_PREV, NULL, "Instance-identifier is missing prefix in the first node.");
            goto error;
        } else {
            mod = prev_mod;
        }

        if (resolve_data(mod, name, name_len, root, &node_match)) {
            /* no instance exists */
            break;
        }

        if (has_predicate) {
            /* we have predicate, so the current results must be list or leaf-list */
            parsed = j = 0;
            /* index of the current node (for lists with position predicates) */
            cur_idx = 1;
            while (j < (signed)node_match.count) {
                node = node_match.node[j];
                parsed = resolve_instid_predicate(mod, &path[i], &node, cur_idx);
                if (parsed < 1) {
                    LOGVAL(ctx, LYE_INPRED, LY_VLOG_LYD, data, &path[i - parsed]);
                    goto error;
                }

                if (!node) {
                    /* current node does not satisfy the predicate */
                    unres_data_del(&node_match, j);
                } else {
                    ++j;
                }
                ++cur_idx;
            }

            i += parsed;
        } else if (node_match.count) {
            /* check that we are not addressing lists */
            for (j = 0; (unsigned)j < node_match.count; ++j) {
                if (node_match.node[j]->schema->nodetype == LYS_LIST) {
                    unres_data_del(&node_match, j--);
                }
            }
            if (!node_match.count) {
                LOGVAL(ctx, LYE_SPEC, LY_VLOG_LYD, data, "Instance identifier is missing list keys.");
            }
        }

        prev_mod = mod;
    }

    if (!node_match.count) {
        /* no instance exists */
        if (req_inst > -1) {
            LOGVAL(ctx, LYE_NOREQINS, LY_VLOG_LYD, data, path);
            return EXIT_FAILURE;
        }
        LOGVRB("There is no instance of \"%s\", but it is not required.", path);
        return EXIT_SUCCESS;
    } else if (node_match.count > 1) {
        /* instance identifier must resolve to a single node */
        LOGVAL(ctx, LYE_TOOMANY, LY_VLOG_LYD, data, path, "data tree");
        goto error;
    } else {
        /* we have required result, remember it and cleanup */
        *ret = node_match.node[0];
        free(node_match.node);
        return EXIT_SUCCESS;
    }

error:
    /* cleanup */
    free(node_match.node);
    return -1;
}